

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void __thiscall
phosg::PrefixedLogger::PrefixedLogger(PrefixedLogger *this,string *prefix,LogLevel min_level)

{
  ::std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix);
  this->min_level = min_level;
  return;
}

Assistant:

PrefixedLogger::PrefixedLogger(const string& prefix, LogLevel min_level)
    : prefix(prefix),
      min_level(min_level) {}